

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,Descriptor *message_type,MessageFactory *factory)

{
  int iVar1;
  undefined4 extraout_var;
  LogMessage *pLVar2;
  undefined4 extraout_var_00;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  undefined4 extraout_var_01;
  
  p_Var4 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var4->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < number]) {
    if (number <= (int)p_Var5[1]._M_color) {
      p_Var3 = p_Var5;
    }
  }
  p_Var5 = &p_Var4->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var4) && (p_Var5 = p_Var3, number < (int)p_Var3[1]._M_color))
  {
    p_Var5 = &p_Var4->_M_header;
  }
  if (((_Rb_tree_header *)p_Var5 != p_Var4) && (((ulong)p_Var5[1]._M_left & 0x10000) == 0)) {
    if (*(char *)((long)&p_Var5[1]._M_left + 1) == '\x01') {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x99);
      pLVar2 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((iter->second).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_98,pLVar2);
      LogMessage::~LogMessage(&local_60);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)&p_Var5[1]._M_left * 4) != 10)
    {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x99);
      pLVar2 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: (cpp_type((iter->second).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_99,pLVar2);
      LogMessage::~LogMessage(&local_98);
    }
    p_Var3 = p_Var5[1]._M_parent;
    if (((ulong)p_Var5[1]._M_left & 0x100000) != 0) {
      iVar1 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
      iVar1 = (*(*(_func_int ***)p_Var3)[3])(p_Var3,CONCAT44(extraout_var_00,iVar1));
      p_Var3 = (_Base_ptr)CONCAT44(extraout_var_01,iVar1);
    }
    return (MessageLite *)p_Var3;
  }
  iVar1 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
  return (MessageLite *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(int number,
                                            const Descriptor* message_type,
                                            MessageFactory* factory) const {
  ExtensionMap::const_iterator iter = extensions_.find(number);
  if (iter == extensions_.end() || iter->second.is_cleared) {
    // Not present.  Return the default value.
    return *factory->GetPrototype(message_type);
  } else {
    GOOGLE_DCHECK_TYPE(iter->second, OPTIONAL, MESSAGE);
    if (iter->second.is_lazy) {
      return iter->second.lazymessage_value->GetMessage(
          *factory->GetPrototype(message_type));
    } else {
      return *iter->second.message_value;
    }
  }
}